

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeCompoundRef(TranslateToFuzzReader *this,Type type)

{
  pointer this_00;
  bool bVar1;
  byte bVar2;
  undefined4 uVar3;
  Index x;
  mapped_type *this_01;
  Expression *value;
  const_iterator cVar4;
  const_iterator cVar5;
  size_type sVar6;
  Const *size;
  HeapType type_00;
  Const *count;
  Expression *local_120;
  Expression *init;
  Field element;
  Expression *local_e0;
  reference local_d8;
  Field *field;
  const_iterator __end4;
  const_iterator __begin4;
  FieldList *__range4;
  undefined1 local_a0 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> values;
  FieldList *fields;
  anon_class_8_1_8991fb9c local_78;
  anon_class_8_1_8991fb9c makeChild;
  undefined1 local_40 [8];
  AutoNester nester;
  HeapType HStack_28;
  int LIMIT;
  HeapType heapType;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  heapType.id = (uintptr_t)this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::isRef((Type *)&this_local);
  if (!bVar1) {
    __assert_fail("type.isRef()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xdf3,"Expression *wasm::TranslateToFuzzReader::makeCompoundRef(Type)");
  }
  HStack_28 = Type::getHeapType((Type *)&this_local);
  bVar1 = HeapType::isBasic(&stack0xffffffffffffffd8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = FeatureSet::hasReferenceTypes((FeatureSet *)(this->wasm + 0x178));
    if (!bVar1) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xdf6,"Expression *wasm::TranslateToFuzzReader::makeCompoundRef(Type)");
    }
    nester.amount._4_4_ = (this->fuzzParams->super_FuzzParams).NESTING_LIMIT + 1;
    AutoNester::AutoNester((AutoNester *)local_40,this);
    bVar1 = Type::isNullable((Type *)&this_local);
    if ((bVar1) &&
       (((bVar1 = Random::finished(&this->random), bVar1 || (nester.amount._4_4_ <= this->nesting))
        || (bVar1 = oneIn(this,(nester.amount._4_4_ - this->nesting) + 1), bVar1)))) {
      type_local.id = (uintptr_t)Builder::makeRefNull(&this->builder,HStack_28);
    }
    else {
      bVar1 = Type::isNonNullable((Type *)&this_local);
      if (((bVar1) &&
          ((bVar1 = Random::finished(&this->random), bVar1 || (nester.amount._4_4_ <= this->nesting)
           ))) && (this->funcContext != (FunctionCreationContext *)0x0)) {
        this_01 = std::
                  unordered_map<wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::operator[](&this->funcContext->typeLocals,(key_type *)&this_local);
        bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(this_01);
        if (bVar1) {
          makeChild.this = (TranslateToFuzzReader *)HStack_28.id;
          value = (Expression *)Builder::makeRefNull(&this->builder,HStack_28);
          type_local.id = (uintptr_t)Builder::makeRefAs(&this->builder,RefAsNonNull,value);
        }
        else {
          type_local.id = (uintptr_t)makeLocalGet(this,(Type)this_local);
        }
      }
      else {
        local_78.this = this;
        uVar3 = wasm::HeapType::getKind();
        switch(uVar3) {
        case 0:
        default:
          wasm::handle_unreachable
                    ("unexpected kind",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,0xe52);
        case 1:
          type_local.id = (uintptr_t)makeRefFuncConst(this,(Type)this_local);
          break;
        case 2:
          values.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)wasm::HeapType::getStruct();
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_a0);
          cVar4 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::begin
                            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                             values.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          cVar5 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::end
                            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                             values.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar1 = std::
                  any_of<__gnu_cxx::__normal_iterator<wasm::Field_const*,std::vector<wasm::Field,std::allocator<wasm::Field>>>,wasm::TranslateToFuzzReader::makeCompoundRef(wasm::Type)::__0>
                            (cVar4._M_current,cVar5._M_current);
          if ((bVar1) || (bVar1 = oneIn(this,2), bVar1)) {
            this_00 = values.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            __end4 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::begin
                               ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                                values.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            field = (Field *)std::vector<wasm::Field,_std::allocator<wasm::Field>_>::end
                                       ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)this_00
                                       );
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                                               *)&field), bVar1) {
              local_d8 = __gnu_cxx::
                         __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                         ::operator*(&__end4);
              local_e0 = makeCompoundRef::anon_class_8_1_8991fb9c::operator()
                                   (&local_78,(Type)(local_d8->type).id);
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_a0
                         ,&local_e0);
              __gnu_cxx::
              __normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
              ::operator++(&__end4);
            }
            bVar1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               local_a0);
            if (!bVar1) {
              sVar6 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 local_a0);
              AutoNester::add((AutoNester *)local_40,sVar6 - 1);
            }
          }
          type_local.id =
               (uintptr_t)
               Builder::
               makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                         (&this->builder,HStack_28,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          local_a0);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_a0);
          break;
        case 3:
          wasm::HeapType::getArray();
          local_120 = (Expression *)0x0;
          bVar2 = wasm::Type::isDefaultable();
          if (((bVar2 & 1) == 0) || (bVar1 = oneIn(this,2), bVar1)) {
            local_120 = makeCompoundRef::anon_class_8_1_8991fb9c::operator()(&local_78,(Type)init);
          }
          x = upTo(this,(this->fuzzParams->super_FuzzParams).MAX_ARRAY_SIZE);
          size = Builder::makeConst<int>(&this->builder,x);
          type_00 = Type::getHeapType((Type *)&this_local);
          type_local.id =
               (uintptr_t)Builder::makeArrayNew(&this->builder,type_00,(Expression *)size,local_120)
          ;
          break;
        case 4:
          wasm::handle_unreachable
                    ("TODO: cont",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,0xe4e);
        }
      }
    }
    AutoNester::~AutoNester((AutoNester *)local_40);
    return (Expression *)type_local.id;
  }
  __assert_fail("!heapType.isBasic()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0xdf5,"Expression *wasm::TranslateToFuzzReader::makeCompoundRef(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeCompoundRef(Type type) {
  assert(type.isRef());
  auto heapType = type.getHeapType();
  assert(!heapType.isBasic());
  assert(wasm.features.hasReferenceTypes());

  // Prefer not to emit a null, in general, as we can trap from them. If it is
  // nullable, give a small chance to do so; if we hit the nesting limit then we
  // really have no choice and must emit a null (or else we could infinitely
  // recurse). For the nesting limit, use a bound that is higher than the normal
  // one, so that the normal mechanisms should prevent us from getting here;
  // this limit is really a last resort we want to never reach. Also, increase
  // the chance to emit a null as |nesting| rises, to avoid deep recursive
  // structures.
  //
  // Note that we might have cycles of types where some are non-nullable. We
  // will only stop here when we exceed the nesting and reach a nullable one.
  // (This assumes there is a nullable one, that is, that the types are
  // inhabitable.)
  const auto LIMIT = fuzzParams->NESTING_LIMIT + 1;
  AutoNester nester(*this);
  if (type.isNullable() &&
      (random.finished() || nesting >= LIMIT || oneIn(LIMIT - nesting + 1))) {
    return builder.makeRefNull(heapType);
  }

  // If the type is non-nullable, but we've run out of input, then we need to do
  // something here to avoid infinite recursion. In the worse case we'll emit a
  // cast to non-null of a null, which validates, but it will trap at runtime
  // which is not ideal.
  if (type.isNonNullable() && (random.finished() || nesting >= LIMIT)) {
    // If we have a function context then we can at least emit a local.get,
    // sometimes, which is less bad. Note that we need to check typeLocals
    // manually here to avoid infinite recursion (as makeLocalGet will fall back
    // to us, if there is no local).
    // TODO: we could also look for locals containing subtypes
    if (funcContext) {
      if (!funcContext->typeLocals[type].empty()) {
        return makeLocalGet(type);
      }
      // No local, but we are in a function context so RefAsNonNull is valid.
      return builder.makeRefAs(RefAsNonNull, builder.makeRefNull(heapType));
    }
    // No function context, so we are in quite the pickle. Continue onwards, as
    // we may succeed to emit something more complex (like a struct.new).
  }

  // When we make children, they must be trivial if we are not in a function
  // context.
  auto makeChild = [&](Type type) {
    return funcContext ? make(type) : makeTrivial(type);
  };

  switch (heapType.getKind()) {
    case HeapTypeKind::Func:
      return makeRefFuncConst(type);
    case HeapTypeKind::Struct: {
      auto& fields = heapType.getStruct().fields;
      std::vector<Expression*> values;
      // If there is a nondefaultable field, we must provide the value and not
      // depend on defaults. Also do that randomly half the time.
      if (std::any_of(
            fields.begin(),
            fields.end(),
            [&](const Field& field) { return !field.type.isDefaultable(); }) ||
          oneIn(2)) {
        for (auto& field : fields) {
          values.push_back(makeChild(field.type));
        }
        // Add more nesting manually, as we can easily get exponential blowup
        // here. This nesting makes it much less likely for a recursive data
        // structure to end up as a massive tree of struct.news, since the
        // nesting limitation code at the top of this function will kick in.
        if (!values.empty()) {
          // Subtract 1 since if there is a single value there cannot be
          // exponential blowup.
          nester.add(values.size() - 1);
        }
      }
      return builder.makeStructNew(heapType, values);
    }
    case HeapTypeKind::Array: {
      auto element = heapType.getArray().element;
      Expression* init = nullptr;
      if (!element.type.isDefaultable() || oneIn(2)) {
        init = makeChild(element.type);
      }
      auto* count =
        builder.makeConst(int32_t(upTo(fuzzParams->MAX_ARRAY_SIZE)));
      return builder.makeArrayNew(type.getHeapType(), count, init);
    }
    case HeapTypeKind::Cont:
      WASM_UNREACHABLE("TODO: cont");
    case HeapTypeKind::Basic:
      break;
  }
  WASM_UNREACHABLE("unexpected kind");
}